

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_36::HttpEntityBodyReader::~HttpEntityBodyReader(HttpEntityBodyReader *this)

{
  HttpInputStreamImpl *pHVar1;
  PromiseFulfiller<void> *pPVar2;
  char (*in_R8) [43];
  Array<char> local_1d0;
  Exception local_1b8;
  
  (this->super_AsyncInputStream)._vptr_AsyncInputStream = (_func_int **)&PTR_read_00590bc0;
  if (this->finished == false) {
    pHVar1 = (this->weakInner).ptr;
    if (pHVar1 == (HttpInputStreamImpl *)0x0) {
      if (kj::_::Debug::minSeverity < 3) {
        getStackTrace();
        kj::_::Debug::log<char_const(&)[54],kj::String>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x76f,ERROR,
                   "\"HTTP body input stream outlived underlying connection\", kj::getStackTrace()",
                   (char (*) [54])"HTTP body input stream outlived underlying connection",
                   &local_1b8.ownFile);
        Array<char>::~Array((Array<char> *)&local_1b8);
      }
    }
    else {
      WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>::unsetCurrentWrapper
                (&pHVar1->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>
                 ,&this->weakInner);
      pPVar2 = (pHVar1->onMessageDone).ptr.ptr;
      if (pPVar2 == (PromiseFulfiller<void> *)0x0) {
        kj::_::Debug::Fault::Fault
                  ((Fault *)&local_1b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x5c9,FAILED,"onMessageDone != nullptr","");
        kj::_::Debug::Fault::fatal((Fault *)&local_1b8);
      }
      kj::_::Debug::makeDescription<char_const(&)[63],char_const(&)[43]>
                ((String *)&local_1d0,
                 (Debug *)
                 "\"application did not finish reading previous HTTP response body\", \"can\'t read next pipelined request/response\""
                 ,"application did not finish reading previous HTTP response body",
                 (char (*) [63])"can\'t read next pipelined request/response",in_R8);
      Exception::Exception
                (&local_1b8,FAILED,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x5cb,(String *)&local_1d0);
      (**(pPVar2->super_PromiseRejector)._vptr_PromiseRejector)(pPVar2,&local_1b8);
      Exception::~Exception(&local_1b8);
      Array<char>::~Array(&local_1d0);
      local_1b8.ownFile.content.ptr = (char *)0x0;
      local_1b8.ownFile.content.size_ = 0;
      Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator=
                (&(pHVar1->onMessageDone).ptr,
                 (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&local_1b8);
      Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose
                ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&local_1b8);
      pHVar1->broken = true;
    }
  }
  AsyncObject::~AsyncObject((AsyncObject *)this);
  return;
}

Assistant:

~HttpEntityBodyReader() noexcept(false) {
    if (!finished) {
      KJ_IF_SOME(inner, weakInner) {
        inner.unsetCurrentWrapper(weakInner);
        inner.abortRead();
      } else {
        // Since we're in a destructor, log an error instead of throwing.
        KJ_LOG(ERROR, "HTTP body input stream outlived underlying connection", kj::getStackTrace());
      }
    }